

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  undefined8 uVar6;
  seqStore_t *psVar7;
  int *piVar8;
  U32 lowestValid;
  size_t sVar9;
  ulong uVar10;
  seqDef *psVar11;
  BYTE *litEnd;
  int iVar12;
  ulong uVar13;
  U32 UVar14;
  size_t sVar15;
  uint uVar16;
  int *piVar17;
  int *piVar18;
  long lVar19;
  ulong uVar20;
  int *iend;
  U32 local_90;
  uint local_8c;
  size_t local_88;
  size_t offsetFound;
  int *local_70;
  seqStore_t *local_68;
  BYTE *litLimit_w;
  ZSTD_matchState_t *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar4 = (ms->window).base;
  uVar3 = (ms->window).dictLimit;
  local_40 = pBVar4 + uVar3;
  local_44 = *rep;
  piVar17 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  iVar12 = (int)piVar17 - (int)pBVar4;
  uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_48 = iVar12 - uVar16;
  if (iVar12 - uVar3 <= uVar16) {
    local_48 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    local_48 = uVar3;
  }
  local_4c = rep[1];
  local_48 = iVar12 - local_48;
  local_8c = local_4c;
  if (local_48 < local_4c) {
    local_8c = 0;
  }
  uVar3 = local_44;
  if (local_48 < local_44) {
    uVar3 = 0;
  }
  uVar13 = (ulong)uVar3;
  pBVar4 = (BYTE *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  litLimit_w = (BYTE *)((long)src + (srcSize - 0x20));
  local_68 = seqStore;
  local_58 = ms;
  local_38 = rep;
LAB_0052c3ba:
  do {
    local_90 = (U32)uVar13;
    lVar19 = -uVar13;
    while( true ) {
      if (local_70 <= piVar17) {
        UVar14 = 0;
        if (local_48 < local_4c) {
          UVar14 = local_4c;
        }
        if (local_48 < local_44) {
          UVar14 = local_44;
        }
        if (local_90 == 0) {
          local_90 = UVar14;
        }
        if (local_8c != 0) {
          UVar14 = local_8c;
        }
        *local_38 = local_90;
        local_38[1] = UVar14;
        return (long)pBVar4 - (long)src;
      }
      if (local_90 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (*(int *)((long)piVar17 + lVar19 + 1) == *(int *)((long)piVar17 + 1)) {
          sVar9 = ZSTD_count((BYTE *)((long)piVar17 + 5),(BYTE *)((long)piVar17 + lVar19 + 5),pBVar4
                            );
          uVar20 = sVar9 + 4;
        }
      }
      offsetFound = 999999999;
      sVar9 = ZSTD_BtFindBestMatch_selectMLS(local_58,(BYTE *)piVar17,pBVar4,&offsetFound);
      uVar10 = uVar20;
      if (uVar20 < sVar9) {
        uVar10 = sVar9;
      }
      if (3 < uVar10) break;
      piVar17 = (int *)((long)piVar17 + ((long)piVar17 - (long)src >> 8) + 1);
    }
    sVar15 = offsetFound;
    if (sVar9 <= uVar20) {
      sVar15 = 0;
    }
    piVar8 = (int *)((long)piVar17 + 1);
    if (uVar20 < sVar9) {
      piVar8 = piVar17;
    }
LAB_0052c467:
    do {
      sVar9 = uVar10;
      iend = piVar8;
      piVar18 = piVar17;
      local_88 = sVar15;
      if (local_70 <= piVar18) break;
      piVar17 = (int *)((long)piVar18 + 1);
      if (local_88 == 0) {
        local_88 = 0;
      }
      else if ((local_90 != 0) && (*piVar17 == *(int *)((long)piVar17 + lVar19))) {
        sVar15 = ZSTD_count((BYTE *)((long)piVar18 + 5),(BYTE *)((long)piVar18 + lVar19 + 5),pBVar4)
        ;
        if (sVar15 < 0xfffffffffffffffc) {
          uVar16 = (int)local_88 + 1;
          uVar3 = 0x1f;
          if (uVar16 != 0) {
            for (; uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          if ((int)((uVar3 ^ 0x1f) + (int)sVar9 * 3 + -0x1e) < (int)(sVar15 + 4) * 3) {
            local_88 = 0;
            iend = piVar17;
            sVar9 = sVar15 + 4;
          }
        }
      }
      offsetFound = 999999999;
      uVar10 = ZSTD_BtFindBestMatch_selectMLS(local_58,(BYTE *)piVar17,pBVar4,&offsetFound);
      if (3 < uVar10) {
        uVar16 = (int)local_88 + 1;
        uVar3 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar16 = (int)offsetFound + 1;
        iVar12 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        sVar15 = offsetFound;
        piVar8 = piVar17;
        if ((int)((uVar3 ^ 0x1f) + (int)sVar9 * 4 + -0x1b) < (int)uVar10 * 4 - iVar12)
        goto LAB_0052c467;
      }
      if (local_70 <= piVar17) break;
      piVar17 = (int *)((long)piVar18 + 2);
      if (local_88 == 0) {
        local_88 = 0;
      }
      else if ((local_90 != 0) && (*piVar17 == *(int *)((long)piVar17 + lVar19))) {
        sVar15 = ZSTD_count((BYTE *)((long)piVar18 + 6),(BYTE *)((long)piVar18 + lVar19 + 6),pBVar4)
        ;
        if (sVar15 < 0xfffffffffffffffc) {
          uVar16 = (int)local_88 + 1;
          uVar3 = 0x1f;
          if (uVar16 != 0) {
            for (; uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          if ((int)((uVar3 ^ 0x1f) + (int)sVar9 * 4 + -0x1e) < (int)(sVar15 + 4) * 4) {
            local_88 = 0;
            iend = piVar17;
            sVar9 = sVar15 + 4;
          }
        }
      }
      offsetFound = 999999999;
      uVar10 = ZSTD_BtFindBestMatch_selectMLS(local_58,(BYTE *)piVar17,pBVar4,&offsetFound);
      if (uVar10 < 4) break;
      uVar16 = (int)local_88 + 1;
      uVar3 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar16 = (int)offsetFound + 1;
      iVar12 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      sVar15 = offsetFound;
      piVar8 = piVar17;
    } while ((int)((uVar3 ^ 0x1f) + (int)sVar9 * 4 + -0x18) < (int)uVar10 * 4 - iVar12);
    if (local_88 == 0) {
      UVar14 = 1;
      uVar13 = (ulong)local_8c;
    }
    else {
      for (; ((src < iend && (local_40 < (BYTE *)((long)iend + (2 - local_88)))) &&
             (*(BYTE *)((long)iend + -1) == *(BYTE *)((long)iend + (1 - local_88))));
          iend = (int *)((long)iend + -1)) {
        sVar9 = sVar9 + 1;
      }
      local_90 = (int)local_88 - 2;
      UVar14 = (int)local_88 + 1;
    }
    uVar20 = (long)iend - (long)src;
    pBVar5 = local_68->lit;
    if (litLimit_w < iend) {
      ZSTD_safecopyLiterals(pBVar5,(BYTE *)src,(BYTE *)iend,litLimit_w);
LAB_0052c6a7:
      local_68->lit = local_68->lit + uVar20;
      psVar11 = local_68->sequences;
      if (0xffff < uVar20) {
        local_68->longLengthType = ZSTD_llt_literalLength;
        local_68->longLengthPos =
             (U32)((ulong)((long)psVar11 - (long)local_68->sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar5 = *src;
      *(undefined8 *)(pBVar5 + 8) = uVar6;
      pBVar5 = local_68->lit;
      if (0x10 < uVar20) {
        uVar6 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar5 + 0x18) = uVar6;
        if (0x20 < (long)uVar20) {
          lVar19 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar19 + 0x20);
            uVar6 = puVar2[1];
            pBVar1 = pBVar5 + lVar19 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar6;
            puVar2 = (undefined8 *)((long)src + lVar19 + 0x30);
            uVar6 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar6;
            lVar19 = lVar19 + 0x20;
          } while (pBVar1 + 0x20 < pBVar5 + uVar20);
        }
        goto LAB_0052c6a7;
      }
      local_68->lit = pBVar5 + uVar20;
      psVar11 = local_68->sequences;
    }
    psVar7 = local_68;
    psVar11->litLength = (U16)uVar20;
    psVar11->offset = UVar14;
    if (0xffff < sVar9 - 3) {
      local_68->longLengthType = ZSTD_llt_matchLength;
      local_68->longLengthPos = (U32)((ulong)((long)psVar11 - (long)local_68->sequencesStart) >> 3);
    }
    psVar11->matchLength = (U16)(sVar9 - 3);
    local_68->sequences = psVar11 + 1;
    src = (void *)((long)iend + sVar9);
    uVar20 = uVar13;
    while (local_8c = (uint)uVar20, piVar17 = (int *)src, local_8c != 0) {
      uVar13 = (ulong)local_90;
      if ((local_70 < src) || (*src != *(int *)((long)src - uVar20))) goto LAB_0052c3ba;
      sVar9 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar20)),pBVar4);
      pBVar5 = psVar7->lit;
      if (litLimit_w < src) {
        ZSTD_safecopyLiterals(pBVar5,(BYTE *)src,(BYTE *)src,litLimit_w);
      }
      else {
        uVar6 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar5 = *src;
        *(undefined8 *)(pBVar5 + 8) = uVar6;
      }
      psVar11 = psVar7->sequences;
      psVar11->litLength = 0;
      psVar11->offset = 1;
      if (0xffff < sVar9 + 1) {
        psVar7->longLengthType = ZSTD_llt_matchLength;
        psVar7->longLengthPos = (U32)((ulong)((long)psVar11 - (long)psVar7->sequencesStart) >> 3);
      }
      psVar11->matchLength = (U16)(sVar9 + 1);
      psVar7->sequences = psVar11 + 1;
      src = (void *)((long)src + sVar9 + 4);
      uVar20 = uVar13;
      local_90 = local_8c;
    }
    uVar13 = (ulong)local_90;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}